

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v6::detail::buffer<char>_> __thiscall
fmt::v6::detail::write<char,char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>>
          (detail *this,back_insert_iterator<fmt::v6::detail::buffer<char>_> out,
          basic_string_view<char> s,basic_format_specs<char> *specs)

{
  long lVar1;
  char *pcVar2;
  uint *puVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_t size;
  char *__n;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  puVar3 = (uint *)s.size_;
  pcVar5 = s.data_;
  pcVar2 = (char *)(long)(int)puVar3[1];
  __n = pcVar5;
  if (pcVar2 < pcVar5) {
    __n = pcVar2;
  }
  if ((long)pcVar2 < 0) {
    __n = pcVar5;
  }
  uVar6 = (ulong)*puVar3;
  if (__n == (char *)0x0 || uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    pcVar2 = (char *)0x0;
    do {
      uVar4 = uVar4 + 1;
      pcVar2 = pcVar2 + 1;
    } while (__n != pcVar2);
  }
  if (-1 < (int)*puVar3) {
    uVar7 = 0;
    if (uVar4 <= uVar6) {
      uVar7 = uVar6 - uVar4;
    }
    uVar6 = uVar7 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                               (ulong)(*(byte *)((long)puVar3 + 9) & 0xf)) & 0x3f);
    lVar1 = *(long *)(this + 0x10);
    pcVar2 = __n + *(byte *)((long)puVar3 + 0xe) * uVar7 + lVar1;
    if (*(char **)(this + 0x18) < pcVar2) {
      (*(code *)**(undefined8 **)this)(this,pcVar2);
    }
    ((buffer<char> *)this)->size_ = (size_t)pcVar2;
    pcVar2 = fill<char*,char>(((buffer<char> *)this)->ptr_ + lVar1,uVar6,
                              (fill_t<char> *)((long)puVar3 + 10));
    if (__n != (char *)0x0) {
      memmove(pcVar2,out.container,(size_t)__n);
    }
    fill<char*,char>(pcVar2 + (long)__n,uVar7 - uVar6,(fill_t<char> *)((long)puVar3 + 10));
    return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)(buffer<char> *)this;
  }
  assert_fail(in_stack_ffffffffffffffc0,0,in_stack_ffffffffffffffb8);
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs = {}) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}